

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawInstancedTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_1::InstancedDrawCase::initPrograms
          (InstancedDrawCase *this,SourceCollections *programCollection)

{
  ProgramSources *pPVar1;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [40];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"InstancedDrawVert",&local_61);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_60);
  glu::VertexSource::VertexSource((VertexSource *)local_40,&this->m_vertexShader);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"InstancedDrawFrag",&local_61);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_60);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_40,&this->m_fragmentShader);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

virtual void initPrograms (vk::SourceCollections& programCollection) const
	{
		programCollection.glslSources.add("InstancedDrawVert") << glu::VertexSource(m_vertexShader);
		programCollection.glslSources.add("InstancedDrawFrag") << glu::FragmentSource(m_fragmentShader);
	}